

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readTiled1.cpp
# Opt level: O3

void readTiledOtherVersions(char *fileName)

{
  int iVar1;
  TiledInputFile in;
  TiledInputFile local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledInputFile::TiledInputFile(local_30,fileName,iVar1);
  Imf_3_4::TiledInputFile::readTile((int)local_30,0,0,0);
  Imf_3_4::TiledInputFile::readTiles((int)local_30,0,0,0,0,0);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

void
readTiledOtherVersions (const char fileName[])
{
    // read tile function versions
    TiledInputFile in(fileName);
    int tileX = 0, tileY = 0, levelX = 0, levelY = 0;
    int tileXMin = 0, tileXMax = 0, tileYMin = 0, tileYMax = 0;
    // [begin v1]
    in.readTile (tileX, tileY, levelX, levelY);
    // [end v1]
    in.readTiles (tileXMin, tileXMax, tileYMin, tileYMax, levelX, levelY);
    // [end v2]
}